

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

Operand * __thiscall IrSim::newLabel(IrSim *this)

{
  Operand *this_00;
  long in_RSI;
  Operand *in_RDI;
  Operand *__lhs;
  string local_50 [28];
  int in_stack_ffffffffffffffcc;
  string local_30 [48];
  
  this_00 = (Operand *)(in_RSI + 0x40);
  *(int *)(in_RSI + 0x78) = *(int *)(in_RSI + 0x78) + 1;
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffcc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  Operand::Operand(this_00,(int)((ulong)__lhs >> 0x20),(string *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return __lhs;
}

Assistant:

Operand newLabel()  { return Operand(OP_LABEL,    labelPrefix  + to_string(labelSeq++)); }